

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O3

void __thiscall CTcGenTarg::build_multimethod_initializers(CTcGenTarg *this)

{
  vm_obj_id_t vVar1;
  uint uVar2;
  size_t sVar3;
  CTcSymFuncBase *this_00;
  CVmHashEntry *this_01;
  uint16_t tmp;
  size_t sVar4;
  tct3_method_gen_ctx *ctx;
  CTcGenTarg *this_02;
  char *pcVar5;
  char buf_1 [2];
  undefined2 uStack_82;
  char buf [4];
  undefined4 uStack_7c;
  CTcDataStream *local_78;
  CTcSymbol *local_70;
  int local_68;
  tct3_method_gen_ctx genctx;
  
  local_68 = 0;
  local_70 = CTcPrsSymtab::find(G_prs->global_symtab_,"_multiMethodRegister",0x14,
                                (CTcPrsSymtab **)0x0);
  open_method(G_cg,G_cs_static,(CTcSymbol *)0x0,(CTcAbsFixup **)0x0,(CTPNCodeBody *)0x0,
              (CTcPrsSymtab *)0x0,0,0,0,0,0,0,&genctx);
  CTcPrsSymtab::enum_entries(G_prs->global_symtab_,multimethod_init_cb,&local_70);
  if (local_68 == 0) {
LAB_001dfd8e:
    ctx = &genctx;
    close_method(G_cg,0,(CTcPrsSymtab *)0x0,(CTcTokFileDesc *)0x0,0,ctx,(CTcNamedArgTab *)0x0);
    close_method_cleanup(G_cg,ctx);
    if (local_68 != 0) {
      if ((local_70 == (CTcSymbol *)0x0) ||
         (*(int *)&(local_70->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                   field_0x24 != 1)) {
        pcVar5 = "_multiMethodRegister";
        goto LAB_001dff9e;
      }
      vVar1 = G_cg->next_obj_;
      G_cg->next_obj_ = vVar1 + 1;
      this->mminit_obj_ = vVar1;
      this_02 = (CTcGenTarg *)G_prs->global_symtab_;
      this_01 = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)ctx);
      uVar2 = this->mminit_obj_;
      CVmHashEntry::CVmHashEntry(this_01,"<multiMethodInit>",0x11,0);
      *(undefined4 *)&this_01->field_0x24 = 2;
      this_01[1]._vptr_CVmHashEntry = (_func_int **)(ulong)uVar2;
      sVar3 = this_01[4].len_;
      this_01[1].nxt_ = (CVmHashEntry *)0xffffffff;
      this_01[4].str_ = (char *)0x0;
      *(undefined8 *)&this_01[3].field_0x20 = 0;
      this_01[4]._vptr_CVmHashEntry = (_func_int **)0x0;
      *(undefined4 *)&this_01[4].nxt_ = 0;
      this_01[1].str_ = (char *)0x0;
      this_01[1].len_ = 0;
      *(undefined8 *)&this_01[1].field_0x20 = 0;
      this_01[2]._vptr_CVmHashEntry = (_func_int **)0x0;
      this_01[2].nxt_ = (CVmHashEntry *)0x0;
      this_01[2].str_ = (char *)0x0;
      this_01[2].len_ = 0;
      *(undefined8 *)&this_01[2].field_0x20 = 0;
      this_01[3]._vptr_CVmHashEntry = (_func_int **)0x0;
      this_01[3].nxt_ = (CVmHashEntry *)0x0;
      *(undefined8 *)((long)&this_01[3].nxt_ + 4) = 0;
      *(undefined8 *)((long)&this_01[3].str_ + 4) = 0;
      *(ushort *)&this_01[4].len_ = ((ushort)(int)sVar3 & 0xf000) + 1;
      this_01->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003187b0;
      (**(code **)(*(long *)this_02 + 0x18))(this_02,this_01);
      sVar4 = (size_t)this->mminit_obj_;
      open_tadsobj(this_02,(tct3_tadsobj_ctx *)buf,G_os,this->mminit_obj_,0,1,0,0);
      _buf_1 = CONCAT22(uStack_82,1);
      CTcDataStream::write(G_os,(int)buf_1,(void *)0x2,sVar4);
      _buf_1 = CONCAT31(stack0xffffffffffffff7d,0xb);
      CTcDataStream::write(G_os,(int)buf_1,(void *)0x1,sVar4);
      CTcAbsFixup::add_abs_fixup
                (&((genctx.anchor)->fixup_info_).internal_fixup_head_,G_os,G_os->ofs_);
      _buf_1 = 0;
      CTcDataStream::write(G_os,(int)buf_1,(void *)0x4,sVar4);
      _buf_1 = CONCAT22(uStack_82,((short)(int)local_78->ofs_ - buf._0_2_) + -6);
      CTcDataStream::write_at(local_78,CONCAT44(uStack_7c,buf) + 4,buf_1,2);
    }
    G_cs = G_cs_main;
  }
  else {
    sVar4 = 0;
    this_00 = (CTcSymFuncBase *)
              CTcPrsSymtab::find(G_prs->global_symtab_,"_multiMethodBuildBindings",0x19,
                                 (CTcPrsSymtab **)0x0);
    if ((this_00 != (CTcSymFuncBase *)0x0) &&
       (*(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                 super_CVmHashEntry.field_0x24 == 1)) {
      write_op(G_cg,'X');
      buf = (char  [4])((uint)buf & 0xffffff00);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x1,sVar4);
      CTcSymFuncBase::add_abs_fixup(this_00,&G_cs->super_CTcDataStream);
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x4,sVar4);
      goto LAB_001dfd8e;
    }
    pcVar5 = "_multiMethodBuildBindings";
LAB_001dff9e:
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e32,pcVar5);
  }
  return;
}

Assistant:

void CTcGenTarg::build_multimethod_initializers()
{
    tct3_method_gen_ctx genctx;
    mminit_ctx ctx;

    /* look up the _multiMethodRegister function */
    ctx.mmr = (CTcSymFunc *)G_prs->get_global_symtab()->find(
        "_multiMethodRegister", 20);

    /* 
     *   open the method - it's a static initializer, so write it to the
     *   static stream 
     */
    G_cg->open_method(G_cs_static, 0, 0, 0, 0, 0, 0, FALSE,
                      FALSE, FALSE, FALSE, &genctx);

    /* scan the symbol table for multimethods and generate initializers */
    G_prs->get_global_symtab()->enum_entries(&multimethod_init_cb, &ctx);

    /* 
     *   if we found any multi-methods, generate a call to
     *   _multiMethodBuildBindings 
     */
    if (ctx.cnt != 0)
    {
        /* look up the function - it's an error if it's not defined */
        CTcSymFunc *mmb = (CTcSymFunc *)G_prs->get_global_symtab()->find(
            "_multiMethodBuildBindings", 25);
        if (mmb == 0 || mmb->get_type() != TC_SYM_FUNC)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_MISSING_MMREG,
                                "_multiMethodBuildBindings");
            return;
        }

        /* write the call instruction */
        G_cg->write_op(OPC_CALL);
        G_cs->write(0);                                   /* argument count */
        mmb->add_abs_fixup(G_cs);                 /* function address fixup */
        G_cs->write4(0);                               /* fixup placeholder */
    }

    /* close the method and clean up */
    G_cg->close_method(0, 0, 0, 0, &genctx, 0);
    G_cg->close_method_cleanup(&genctx);

    /* 
     *   if we generated any registrations, create the initializer object -
     *   this will go in the static initializer block to trigger invocation
     *   of the registration routine at load time 
     */
    if (ctx.cnt != 0)
    {
        /* we have multi-methods, so we definitely need _multiMethodRegister */
        if (ctx.mmr == 0 || ctx.mmr->get_type() != TC_SYM_FUNC)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_MISSING_MMREG,
                                "_multiMethodRegister");
            return;
        }

        /* create an anonymous object to hold the initializer code */
        mminit_obj_ = G_cg->new_obj_id();

        /* add a debugging symbol for it */
        G_prs->get_global_symtab()->add_entry(new CTcSymObj(
            "<multiMethodInit>", 17, FALSE, mminit_obj_, TRUE,
            TC_META_TADSOBJ, 0));

        /* write the object header: no superclasses, 1 property */
        tct3_tadsobj_ctx obj_ctx;
        open_tadsobj(&obj_ctx, G_os, mminit_obj_, 0, 1, 0, 0);
        
        /* write the static initializer property */
        G_os->write2(1);                           /* arbitrary property ID */
        G_os->write(VM_CODEOFS);    /* offset of the code we just generated */
        CTcAbsFixup::add_abs_fixup(
            &genctx.anchor->fixup_info_.internal_fixup_head_,
            G_os, G_os->get_ofs());
        G_os->write4(0);                                     /* placeholder */
        
        /* fix up the object size data */
        close_tadsobj(&obj_ctx);
    }

    /* switch back to the main stream */
    G_cs = G_cs_main;
}